

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteLoop<unsigned_char,signed_char,duckdb::GenericUnaryWrapper,duckdb::VectorTryCastOperator<duckdb::NumericTryCast>>
               (uchar *ldata,char *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  sel_t *psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  char cVar5;
  ulong uVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  _Head_base<0UL,_unsigned_long_*,_false> _Var8;
  idx_t iVar9;
  idx_t idx_in_entry;
  ulong idx;
  idx_t idx_00;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_40;
  idx_t local_38;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      psVar1 = sel_vector->sel_vector;
      idx_00 = 0;
      do {
        iVar9 = idx_00;
        if (psVar1 != (sel_t *)0x0) {
          iVar9 = (idx_t)psVar1[idx_00];
        }
        cVar5 = VectorTryCastOperator<duckdb::NumericTryCast>::Operation<unsigned_char,signed_char>
                          (ldata[iVar9],result_mask,idx_00,dataptr);
        result_data[idx_00] = cVar5;
        idx_00 = idx_00 + 1;
      } while (count != idx_00);
    }
  }
  else if (count != 0) {
    psVar1 = sel_vector->sel_vector;
    local_40 = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    idx = 0;
    do {
      uVar6 = idx;
      if (psVar1 != (sel_t *)0x0) {
        uVar6 = (ulong)psVar1[idx];
      }
      if (((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[uVar6 >> 6] >>
           (uVar6 & 0x3f) & 1) == 0) {
        _Var8._M_head_impl = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask
        ;
        if (_Var8._M_head_impl == (unsigned_long *)0x0) {
          local_38 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var4 = p_Stack_50;
          peVar3 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar3;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var4;
          if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
             p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_40);
          _Var8._M_head_impl =
               (pTVar7->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               _Var8._M_head_impl;
        }
        bVar2 = (byte)idx & 0x3f;
        _Var8._M_head_impl[idx >> 6] =
             _Var8._M_head_impl[idx >> 6] & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
      }
      else {
        cVar5 = VectorTryCastOperator<duckdb::NumericTryCast>::Operation<unsigned_char,signed_char>
                          (ldata[uVar6],result_mask,idx,dataptr);
        result_data[idx] = cVar5;
      }
      idx = idx + 1;
    } while (count != idx);
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}